

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptPostDecls(HlslGrammar *this,TQualifier *qualifier)

{
  pointer pcVar1;
  TSourceLoc loc;
  long lVar2;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TBuiltInVariable builtIn;
  char *pcVar7;
  long lVar8;
  TQualifier *pTVar9;
  HlslParseContext *pHVar10;
  _func_int **pp_Var11;
  undefined8 profile;
  int subComponent;
  TString semanticUpperCase;
  HlslToken idToken;
  TString local_d8;
  HlslToken local_a8;
  TString *local_78;
  int iStack_70;
  int iStack_6c;
  undefined8 local_68;
  HlslToken local_58;
  
  bVar5 = false;
  do {
    bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar4) {
      local_a8.field_2.string =
           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0;
      local_a8.loc.name = (TString *)0x0;
      local_a8.loc.string = 0;
      local_a8.loc.line = 0;
      local_a8.loc.column = 0;
      bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLayout);
      if (!bVar5) {
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokPackOffset);
        if (bVar5) {
          bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
          if (!bVar5) {
LAB_00428087:
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar7 = "(";
LAB_00428111:
            (*pp_Var11[0x2d])(pHVar10,&(this->super_HlslTokenStream).token,"Expected",pcVar7,"");
            return false;
          }
          local_d8.field_2._8_8_ = (TString *)0x0;
          local_d8._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x0;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length._0_4_ = 0;
          bVar5 = acceptIdentifier(this,(HlslToken *)&local_d8);
          if (!bVar5) {
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar7 = "c[subcomponent][.component]";
            goto LAB_00428111;
          }
          local_58.field_2.string = (TString *)0x0;
          bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDot);
          if ((bVar5) && (bVar5 = acceptIdentifier(this,&local_58), !bVar5)) {
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar7 = "component";
LAB_00428178:
            (*pp_Var11[0x2d])(pHVar10,&(this->super_HlslTokenStream).token,"Expected",pcVar7,"");
            iVar6 = 1;
            goto LAB_004281c6;
          }
          bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
          pHVar10 = this->parseContext;
          if (bVar5) {
            HlslParseContext::handlePackOffset
                      (pHVar10,(TSourceLoc *)&local_d8,qualifier,(TString *)local_d8.field_2._8_8_,
                       local_58.field_2.string);
            goto LAB_00427d98;
          }
          goto LAB_004280a5;
        }
        bVar5 = acceptIdentifier(this,&local_a8);
        aVar3 = local_a8.field_2;
        if (!bVar5) {
          pHVar10 = this->parseContext;
          pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar7 = "layout, semantic, packoffset, or register";
          goto LAB_00428111;
        }
        iVar6 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (local_a8.field_2.string,"register");
        if (iVar6 != 0) {
          local_d8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar1 = ((aVar3.string)->_M_dataplus)._M_p;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_d8,pcVar1,pcVar1 + (aVar3.string)->_M_string_length);
          pcVar1 = local_d8._M_dataplus._M_p;
          lVar2 = CONCAT44(local_d8._M_string_length._4_4_,(undefined4)local_d8._M_string_length);
          if (lVar2 != 0) {
            lVar8 = 0;
            do {
              iVar6 = toupper((int)pcVar1[lVar8]);
              pcVar1[lVar8] = (char)iVar6;
              lVar8 = lVar8 + 1;
            } while (lVar2 != lVar8);
          }
          pHVar10 = this->parseContext;
          local_68 = CONCAT44(local_a8.loc._20_4_,local_a8.loc.column);
          local_78 = local_a8.loc.name;
          iStack_70 = local_a8.loc.string;
          iStack_6c = local_a8.loc.line;
          builtIn = HlslScanContext::mapSemantic
                              ((this->super_HlslTokenStream).scanner,local_d8._M_dataplus._M_p);
          loc.string = iStack_70;
          loc.line = iStack_6c;
          loc.name = local_78;
          loc._16_8_ = local_68;
          HlslParseContext::handleSemantic(pHVar10,loc,qualifier,builtIn,&local_d8);
          goto LAB_00427d98;
        }
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
        if (!bVar5) goto LAB_00428087;
        local_d8.field_2._8_8_ = (TString *)0x0;
        local_d8._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x0;
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length._0_4_ = 0;
        bVar5 = acceptIdentifier(this,(HlslToken *)&local_d8);
        iVar6 = 1;
        if (bVar5) {
          if (((*(size_type *)(local_d8.field_2._8_8_ + 0x10) < 2) ||
              ((int)(*(pointer *)(local_d8.field_2._8_8_ + 8))[1] - 0x30U < 10)) ||
             (bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
             profile = local_d8.field_2._8_8_, !bVar5)) {
            profile = (TString *)0x0;
          }
          else {
            bVar5 = acceptIdentifier(this,(HlslToken *)&local_d8);
            if (!bVar5) goto LAB_0042814a;
          }
          bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBracket);
          subComponent = 0;
          if (!bVar5) {
LAB_00428013:
            local_58.field_2.string = (TString *)0x0;
            bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
            if ((bVar5) && (bVar5 = acceptIdentifier(this,&local_58), !bVar5)) {
              pHVar10 = this->parseContext;
              pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar7 = "space identifier";
              goto LAB_00428178;
            }
            bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
            pHVar10 = this->parseContext;
            if (bVar5) {
              HlslParseContext::handleRegister
                        (pHVar10,(TSourceLoc *)&local_d8,qualifier,(TString *)profile,
                         (TString *)local_d8.field_2._8_8_,subComponent,local_58.field_2.string);
              goto LAB_00427d98;
            }
LAB_004280a5:
            (*(pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (pHVar10,&(this->super_HlslTokenStream).token,"Expected",")","");
            iVar6 = 2;
LAB_004281c6:
            return iVar6 == 2;
          }
          bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
          if (bVar5) {
            subComponent = (this->super_HlslTokenStream).token.field_2.i;
            HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
            bVar5 = HlslTokenStream::acceptTokenClass
                              (&this->super_HlslTokenStream,EHTokRightBracket);
            if (bVar5) goto LAB_00428013;
            iVar6 = 2;
            pcVar7 = "]";
          }
          else {
            pcVar7 = "literal integer";
          }
        }
        else {
LAB_0042814a:
          pcVar7 = "register number description";
        }
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,"Expected",pcVar7,"");
        goto LAB_004281c6;
      }
      acceptLayoutQualifierList(this,qualifier);
    }
    else {
      pTVar9 = (TQualifier *)0x175;
      bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
      if (!bVar4) {
        return bVar5;
      }
      acceptAnnotations(this,pTVar9);
    }
LAB_00427d98:
    bVar5 = true;
  } while( true );
}

Assistant:

bool HlslGrammar::acceptPostDecls(TQualifier& qualifier)
{
    bool found = false;

    do {
        // COLON
        if (acceptTokenClass(EHTokColon)) {
            found = true;
            HlslToken idToken;
            if (peekTokenClass(EHTokLayout))
                acceptLayoutQualifierList(qualifier);
            else if (acceptTokenClass(EHTokPackOffset)) {
                // PACKOFFSET LEFT_PAREN c[Subcomponent][.component] RIGHT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken locationToken;
                if (! acceptIdentifier(locationToken)) {
                    expected("c[subcomponent][.component]");
                    return false;
                }
                HlslToken componentToken;
                if (acceptTokenClass(EHTokDot)) {
                    if (! acceptIdentifier(componentToken)) {
                        expected("component");
                        return false;
                    }
                }
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handlePackOffset(locationToken.loc, qualifier, *locationToken.string, componentToken.string);
            } else if (! acceptIdentifier(idToken)) {
                expected("layout, semantic, packoffset, or register");
                return false;
            } else if (*idToken.string == "register") {
                // REGISTER LEFT_PAREN [shader_profile,] Type#[subcomp]opt (COMMA SPACEN)opt RIGHT_PAREN
                // LEFT_PAREN
                if (! acceptTokenClass(EHTokLeftParen)) {
                    expected("(");
                    return false;
                }
                HlslToken registerDesc;  // for Type#
                HlslToken profile;
                if (! acceptIdentifier(registerDesc)) {
                    expected("register number description");
                    return false;
                }
                if (registerDesc.string->size() > 1 && !isdigit((*registerDesc.string)[1]) &&
                                                       acceptTokenClass(EHTokComma)) {
                    // Then we didn't really see the registerDesc yet, it was
                    // actually the profile.  Adjust...
                    profile = registerDesc;
                    if (! acceptIdentifier(registerDesc)) {
                        expected("register number description");
                        return false;
                    }
                }
                int subComponent = 0;
                if (acceptTokenClass(EHTokLeftBracket)) {
                    // LEFT_BRACKET subcomponent RIGHT_BRACKET
                    if (! peekTokenClass(EHTokIntConstant)) {
                        expected("literal integer");
                        return false;
                    }
                    subComponent = token.i;
                    advanceToken();
                    if (! acceptTokenClass(EHTokRightBracket)) {
                        expected("]");
                        break;
                    }
                }
                // (COMMA SPACEN)opt
                HlslToken spaceDesc;
                if (acceptTokenClass(EHTokComma)) {
                    if (! acceptIdentifier(spaceDesc)) {
                        expected ("space identifier");
                        return false;
                    }
                }
                // RIGHT_PAREN
                if (! acceptTokenClass(EHTokRightParen)) {
                    expected(")");
                    break;
                }
                parseContext.handleRegister(registerDesc.loc, qualifier, profile.string, *registerDesc.string, subComponent, spaceDesc.string);
            } else {
                // semantic, in idToken.string
                TString semanticUpperCase = *idToken.string;
                std::transform(semanticUpperCase.begin(), semanticUpperCase.end(), semanticUpperCase.begin(), ::toupper);
                parseContext.handleSemantic(idToken.loc, qualifier, mapSemantic(semanticUpperCase.c_str()), semanticUpperCase);
            }
        } else if (peekTokenClass(EHTokLeftAngle)) {
            found = true;
            acceptAnnotations(qualifier);
        } else
            break;

    } while (true);

    return found;
}